

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void P_WriteDemoWeaponsChunk(BYTE **demo)

{
  uint uVar1;
  PClassWeapon **ppPVar2;
  char *string;
  uint local_14;
  uint i;
  BYTE **demo_local;
  
  uVar1 = TArray<PClassWeapon_*,_PClassWeapon_*>::Size(&Weapons_ntoh);
  WriteWord((short)uVar1,demo);
  local_14 = 1;
  while( true ) {
    uVar1 = TArray<PClassWeapon_*,_PClassWeapon_*>::Size(&Weapons_ntoh);
    if (uVar1 <= local_14) break;
    ppPVar2 = TArray<PClassWeapon_*,_PClassWeapon_*>::operator[](&Weapons_ntoh,(ulong)local_14);
    string = FName::GetChars(&((*ppPVar2)->super_PClassInventory).super_PClassActor.super_PClass.
                              super_PNativeStruct.super_PStruct.super_PNamedType.TypeName);
    WriteString(string,demo);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void P_WriteDemoWeaponsChunk(BYTE **demo)
{
	WriteWord(Weapons_ntoh.Size(), demo);
	for (unsigned int i = 1; i < Weapons_ntoh.Size(); ++i)
	{
		WriteString(Weapons_ntoh[i]->TypeName.GetChars(), demo);
	}
}